

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::FormalArgumentSymbol::getDefaultValue(FormalArgumentSymbol *this)

{
  bitmask<slang::ast::ASTFlags> flags;
  Symbol *symbol;
  Expression *pEVar2;
  Symbol *in_RDI;
  LookupLocation LVar3;
  ExpressionSyntax *unaff_retaddr;
  ArgumentDirection in_stack_0000000c;
  Type *in_stack_00000010;
  bitmask<slang::ast::VariableFlags> in_stack_0000001e;
  ASTContext context;
  Scope *scope;
  undefined6 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff86;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff88;
  ASTContext *in_stack_fffffffffffffff8;
  Scope *pSVar1;
  
  if ((*(long *)&in_RDI[5].indexInScope == 0) && (in_RDI[5].nextInScope != (Symbol *)0x0)) {
    symbol = (Symbol *)Symbol::getParentScope(in_RDI);
    LVar3 = LookupLocation::after(symbol);
    pSVar1 = LVar3.scope;
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffff88,NotADriver);
    LVar3._8_8_ = pSVar1;
    LVar3.scope = (Scope *)in_stack_ffffffffffffff88.m_bits;
    flags.m_bits._6_2_ = in_stack_ffffffffffffff86;
    flags.m_bits._0_6_ = in_stack_ffffffffffffff80;
    ASTContext::ASTContext((ASTContext *)in_RDI,(Scope *)symbol,LVar3,flags);
    ValueSymbol::getType((ValueSymbol *)0x9d764f);
    pEVar2 = Expression::bindArgument
                       (in_stack_00000010,in_stack_0000000c,in_stack_0000001e,unaff_retaddr,
                        in_stack_fffffffffffffff8);
    *(Expression **)&in_RDI[5].indexInScope = pEVar2;
    pEVar2 = *(Expression **)&in_RDI[5].indexInScope;
  }
  else {
    pEVar2 = *(Expression **)&in_RDI[5].indexInScope;
  }
  return pEVar2;
}

Assistant:

const Expression* FormalArgumentSymbol::getDefaultValue() const {
    if (defaultVal || !defaultValSyntax)
        return defaultVal;

    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    ASTContext context(*scope, LookupLocation::after(*this), ASTFlags::NotADriver);
    defaultVal = &Expression::bindArgument(getType(), direction, flags, *defaultValSyntax, context);
    return defaultVal;
}